

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O0

int __thiscall
icu_63::PluralRules::select
          (PluralRules *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  undefined4 in_register_00000034;
  ConstChar16Ptr local_28;
  fd_set *local_20;
  IFixedDecimal *number_local;
  PluralRules *this_local;
  
  number_local = (IFixedDecimal *)CONCAT44(in_register_00000034,__nfds);
  local_20 = __readfds;
  this_local = this;
  if (number_local[1]._vptr_IFixedDecimal == (_func_int **)0x0) {
    ConstChar16Ptr::ConstChar16Ptr(&local_28,(char16_t *)PLURAL_DEFAULT_RULE);
    UnicodeString::UnicodeString((UnicodeString *)this,'\x01',&local_28,-1);
    ConstChar16Ptr::~ConstChar16Ptr(&local_28);
  }
  else {
    RuleChain::select((RuleChain *)this,(int)number_local[1]._vptr_IFixedDecimal,__readfds,
                      __writefds,__exceptfds,__timeout);
  }
  return (int)this;
}

Assistant:

UnicodeString
PluralRules::select(const IFixedDecimal &number) const {
    if (mRules == nullptr) {
        return UnicodeString(TRUE, PLURAL_DEFAULT_RULE, -1);
    }
    else {
        return mRules->select(number);
    }
}